

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utl.cpp
# Opt level: O0

bool __thiscall utl::file_line_iterator::equal(file_line_iterator *this,file_line_iterator *other)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  fpos<__mbstate_t> local_200;
  fpos<__mbstate_t> local_1f0;
  undefined1 local_1d9;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  file_line_iterator *local_20;
  file_line_iterator *other_local;
  file_line_iterator *this_local;
  
  local_20 = other;
  other_local = this;
  bVar1 = boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator!
                    (&this->is);
  if ((bVar1) &&
     (bVar1 = boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator!
                        (&local_20->is), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator!
                      (&this->is);
    if ((bVar1) ||
       (bVar1 = boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator!
                          (&local_20->is), bVar1)) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = boost::operator==(&this->is,&local_20->is);
      if (!bVar1) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar2 = std::operator<<(local_198,"Failed to ensure condition ");
        poVar2 = std::operator<<(poVar2,"is == other.is");
        poVar2 = std::operator<<(poVar2,"\n");
        poVar2 = std::operator<<(poVar2,"at (");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/utl.cpp"
                                );
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = std::operator<<(poVar2,"equal");
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x49);
        poVar2 = std::operator<<(poVar2,") \n ");
        poVar2 = std::operator<<(poVar2,"Message : ");
        poVar2 = std::operator<<(poVar2,"\"cannot compare distinct istream iters\"");
        std::operator<<(poVar2,"\n");
        local_1d9 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(this_00,local_1d8);
        local_1d9 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator->(&this->is);
      local_1f0 = (fpos<__mbstate_t>)std::istream::tellg();
      boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator->
                (&local_20->is);
      local_200 = (fpos<__mbstate_t>)std::istream::tellg();
      this_local._7_1_ = std::operator==(&local_1f0,&local_200);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool file_line_iterator::equal(file_line_iterator const& other) const
{
  if(!is && !other.is)
    return true;

  if(!is || !other.is)
    return false;

  ENSURE(is == other.is, "cannot compare distinct istream iters");

  return is->tellg() == other.is->tellg();
}